

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_poscall(lua_State *L,CallInfo *ci,StkId firstResult,int nres)

{
  undefined8 *puVar1;
  ushort uVar2;
  StkId pTVar3;
  Value *pVVar4;
  undefined8 uVar5;
  Value VVar6;
  uint uVar7;
  uint uVar8;
  CallInfo *pCVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  Value *pVVar13;
  TValue *pTVar14;
  ulong uVar15;
  
  uVar2 = ci->nresults;
  uVar11 = (uint)(short)uVar2;
  if ((L->hookmask & 6U) == 0) {
    pCVar9 = ci->previous;
    pTVar14 = firstResult;
  }
  else {
    if ((L->hookmask & 2U) != 0) {
      pTVar3 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar3) + (long)L->stack);
    }
    pCVar9 = ci->previous;
    L->oldpc = (pCVar9->u).l.savedpc;
    pTVar14 = firstResult;
  }
  uVar8 = 1;
  pVVar4 = &ci->func->value_;
  L->ci = pCVar9;
  uVar7 = (uint)uVar2;
  if (uVar2 != 0) {
    if (uVar7 == 1) {
      if (nres == 0) {
        pTVar14 = &luaO_nilobject_;
      }
      VVar6 = *(Value *)&pTVar14->tt_;
      *pVVar4 = pTVar14->value_;
      pVVar4[1] = VVar6;
      uVar8 = 1;
      uVar7 = uVar8;
    }
    else if (uVar7 == 0xffff) {
      uVar8 = 0;
      uVar10 = 0;
      if (0 < nres) {
        uVar10 = (ulong)(uint)nres;
      }
      for (lVar12 = 0; uVar7 = nres, uVar10 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        puVar1 = (undefined8 *)((long)&pTVar14->value_ + lVar12);
        uVar5 = puVar1[1];
        *(undefined8 *)((long)pVVar4 + lVar12) = *puVar1;
        ((undefined8 *)((long)pVVar4 + lVar12))[1] = uVar5;
      }
    }
    else {
      uVar10 = 0;
      uVar7 = uVar11;
      if (nres < (int)uVar11) {
        uVar15 = (ulong)(uint)nres;
        if (nres < 1) {
          uVar15 = uVar10;
        }
        for (; uVar15 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
          puVar1 = (undefined8 *)((long)&pTVar14->value_ + uVar10);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)pVVar4 + uVar10) = *puVar1;
          ((undefined8 *)((long)pVVar4 + uVar10))[1] = uVar5;
        }
        pVVar13 = pVVar4 + uVar15 * 2 + 1;
        for (; (long)uVar15 < (long)(int)uVar11; uVar15 = uVar15 + 1) {
          pVVar13->b = 0;
          pVVar13 = pVVar13 + 2;
        }
      }
      else {
        uVar15 = 0;
        if (0 < (short)uVar2) {
          uVar15 = (ulong)uVar11;
        }
        for (; uVar15 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
          puVar1 = (undefined8 *)((long)&pTVar14->value_ + uVar10);
          uVar5 = puVar1[1];
          *(undefined8 *)((long)pVVar4 + uVar10) = *puVar1;
          ((undefined8 *)((long)pVVar4 + uVar10))[1] = uVar5;
        }
      }
    }
  }
  L->top = (StkId)(pVVar4 + (long)(int)uVar7 * 2);
  return uVar8;
}

Assistant:

int luaD_poscall(lua_State *L, CallInfo *ci, StkId firstResult, int nres) {
    StkId res;
    int wanted = ci->nresults;
    if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
        if (L->hookmask & LUA_MASKRET) {
            ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
            luaD_hook(L, LUA_HOOKRET, -1);
            firstResult = restorestack(L, fr);
        }
        L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
    }
    res = ci->func;  /* res == final position of 1st result */
    L->ci = ci->previous;  /* back to caller */
    /* move results to proper place */
    return moveresults(L, firstResult, res, nres, wanted);
}